

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_get_ns_cert_type(uchar **p,uchar *end,uchar *ns_cert_type)

{
  int iVar1;
  undefined1 local_48 [8];
  mbedtls_x509_bitstring bs;
  int ret;
  uchar *ns_cert_type_local;
  uchar *end_local;
  uchar **p_local;
  
  memset(local_48,0,0x18);
  iVar1 = mbedtls_asn1_get_bitstring(p,end,(mbedtls_asn1_bitstring *)local_48);
  if (iVar1 == 0) {
    if (local_48 == (undefined1  [8])0x1) {
      *ns_cert_type = *(uchar *)bs._8_8_;
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = -0x2564;
    }
  }
  else {
    p_local._4_4_ = iVar1 + -0x2500;
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_ns_cert_type( unsigned char **p,
                                       const unsigned char *end,
                                       unsigned char *ns_cert_type)
{
    int ret;
    mbedtls_x509_bitstring bs = { 0, 0, NULL };

    if( ( ret = mbedtls_asn1_get_bitstring( p, end, &bs ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

    if( bs.len != 1 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_INVALID_LENGTH );

    /* Get actual bitstring */
    *ns_cert_type = *bs.p;
    return( 0 );
}